

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeBufferApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::bind_buffer_range(NegativeTestContext *ctx)

{
  NegativeTestContext *pNVar1;
  bool bVar2;
  RenderContext *pRVar3;
  allocator<char> local_1f9;
  string local_1f8;
  allocator<char> local_1d1;
  string local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  allocator<char> local_181;
  string local_180;
  GLint local_160;
  GLuint local_15c;
  int ssAlignment;
  int maxSSize;
  int maxACize;
  allocator<char> local_149;
  string local_148;
  allocator<char> local_121;
  string local_120;
  allocator<char> local_f9;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  string local_a8;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  GLint local_28;
  GLuint local_24;
  int uAlignment;
  int maxUSize;
  int maxTFSize;
  deUint32 bufTF;
  deUint32 bufU;
  deUint32 bufAC;
  NegativeTestContext *ctx_local;
  
  bufTF = 0x1234;
  maxTFSize = 0x1234;
  maxUSize = 0x1234;
  uAlignment = 0x1234;
  local_24 = 0x1234;
  local_28 = 0x1234;
  _bufU = ctx;
  glu::CallLogWrapper::glGenBuffers(&ctx->super_CallLogWrapper,1,(GLuint *)&maxTFSize);
  glu::CallLogWrapper::glBindBuffer(&_bufU->super_CallLogWrapper,0x8a11,maxTFSize);
  glu::CallLogWrapper::glBufferData(&_bufU->super_CallLogWrapper,0x8a11,0x10,(void *)0x0,0x88e0);
  glu::CallLogWrapper::glGenBuffers(&_bufU->super_CallLogWrapper,1,(GLuint *)&maxUSize);
  glu::CallLogWrapper::glBindBuffer(&_bufU->super_CallLogWrapper,0x8c8e,maxUSize);
  glu::CallLogWrapper::glBufferData(&_bufU->super_CallLogWrapper,0x8c8e,0x10,(void *)0x0,0x88e0);
  glu::CallLogWrapper::glGenBuffers(&_bufU->super_CallLogWrapper,1,&bufTF);
  glu::CallLogWrapper::glBindBuffer(&_bufU->super_CallLogWrapper,0x92c0,bufTF);
  glu::CallLogWrapper::glBufferData(&_bufU->super_CallLogWrapper,0x92c0,0x10,(void *)0x0,0x88e0);
  pNVar1 = _bufU;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_48,
             "GL_INVALID_ENUM is generated if target is not GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BUFFER, GL_TRANSFORM_FEEDBACK_BUFFER or GL_UNIFORM_BUFFER."
             ,&local_49);
  NegativeTestContext::beginSection(pNVar1,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  glu::CallLogWrapper::glBindBufferRange(&_bufU->super_CallLogWrapper,0x8892,0,maxTFSize,0,4);
  NegativeTestContext::expectError(_bufU,0x500);
  NegativeTestContext::endSection(_bufU);
  pNVar1 = _bufU;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER and index is greater than or equal to GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS."
             ,&local_81);
  NegativeTestContext::beginSection(pNVar1,&local_80);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  glu::CallLogWrapper::glGetIntegerv(&_bufU->super_CallLogWrapper,0x8c8b,&uAlignment);
  glu::CallLogWrapper::glBindBufferRange
            (&_bufU->super_CallLogWrapper,0x8c8e,uAlignment,maxUSize,0,4);
  NegativeTestContext::expectError(_bufU,0x501);
  NegativeTestContext::endSection(_bufU);
  pNVar1 = _bufU;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,
             "GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and index is greater than or equal to GL_MAX_UNIFORM_BUFFER_BINDINGS."
             ,&local_a9);
  NegativeTestContext::beginSection(pNVar1,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  std::allocator<char>::~allocator(&local_a9);
  glu::CallLogWrapper::glGetIntegerv(&_bufU->super_CallLogWrapper,0x8a2f,(GLint *)&local_24);
  glu::CallLogWrapper::glBindBufferRange(&_bufU->super_CallLogWrapper,0x8a11,local_24,maxTFSize,0,4)
  ;
  NegativeTestContext::expectError(_bufU,0x501);
  NegativeTestContext::endSection(_bufU);
  pNVar1 = _bufU;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,
             "GL_INVALID_VALUE is generated if size is less than or equal to zero.",&local_d1);
  NegativeTestContext::beginSection(pNVar1,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  glu::CallLogWrapper::glBindBufferRange(&_bufU->super_CallLogWrapper,0x8a11,0,maxTFSize,0,-1);
  NegativeTestContext::expectError(_bufU,0x501);
  glu::CallLogWrapper::glBindBufferRange(&_bufU->super_CallLogWrapper,0x8a11,0,maxTFSize,0,0);
  NegativeTestContext::expectError(_bufU,0x501);
  NegativeTestContext::endSection(_bufU);
  pNVar1 = _bufU;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_f8,"GL_INVALID_VALUE is generated if offset is less than zero.",
             &local_f9);
  NegativeTestContext::beginSection(pNVar1,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::allocator<char>::~allocator(&local_f9);
  glu::CallLogWrapper::glBindBufferRange(&_bufU->super_CallLogWrapper,0x8a11,0,maxTFSize,-1,0);
  NegativeTestContext::expectError(_bufU,0x501);
  NegativeTestContext::endSection(_bufU);
  pNVar1 = _bufU;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_120,
             "GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER and size or offset are not multiples of 4."
             ,&local_121);
  NegativeTestContext::beginSection(pNVar1,&local_120);
  std::__cxx11::string::~string((string *)&local_120);
  std::allocator<char>::~allocator(&local_121);
  glu::CallLogWrapper::glBindBufferRange(&_bufU->super_CallLogWrapper,0x8c8e,0,maxUSize,4,5);
  NegativeTestContext::expectError(_bufU,0x501);
  glu::CallLogWrapper::glBindBufferRange(&_bufU->super_CallLogWrapper,0x8c8e,0,maxUSize,5,4);
  NegativeTestContext::expectError(_bufU,0x501);
  glu::CallLogWrapper::glBindBufferRange(&_bufU->super_CallLogWrapper,0x8c8e,0,maxUSize,5,7);
  NegativeTestContext::expectError(_bufU,0x501);
  NegativeTestContext::endSection(_bufU);
  pNVar1 = _bufU;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,
             "GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and offset is not a multiple of GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT."
             ,&local_149);
  NegativeTestContext::beginSection(pNVar1,&local_148);
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  glu::CallLogWrapper::glGetIntegerv(&_bufU->super_CallLogWrapper,0x8a34,&local_28);
  glu::CallLogWrapper::glBindBufferRange
            (&_bufU->super_CallLogWrapper,0x8a11,0,maxTFSize,(long)(local_28 + 1),4);
  NegativeTestContext::expectError(_bufU,0x501);
  NegativeTestContext::endSection(_bufU);
  pRVar3 = NegativeTestContext::getRenderContext(_bufU);
  maxACize = (*pRVar3->_vptr_RenderContext[2])();
  maxSSize = (int)glu::ApiType::es(3,2);
  bVar2 = glu::contextSupports((ContextType)maxACize,(ApiType)maxSSize);
  pNVar1 = _bufU;
  if (bVar2) {
    ssAlignment = 0x1234;
    local_15c = 0x1234;
    local_160 = 0x1234;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_180,
               "GL_INVALID_VALUE is generated if target is GL_ATOMIC_COUNTER_BUFFER and index is greater than or equal to GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS."
               ,&local_181);
    NegativeTestContext::beginSection(pNVar1,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    glu::CallLogWrapper::glGetIntegerv(&_bufU->super_CallLogWrapper,0x92dc,&ssAlignment);
    glu::CallLogWrapper::glBindBufferRange
              (&_bufU->super_CallLogWrapper,0x92c0,ssAlignment,maxTFSize,0,4);
    NegativeTestContext::expectError(_bufU,0x501);
    NegativeTestContext::endSection(_bufU);
    pNVar1 = _bufU;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a8,
               "GL_INVALID_VALUE is generated if target is GL_SHADER_STORAGE_BUFFER and index is greater than or equal to GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS."
               ,&local_1a9);
    NegativeTestContext::beginSection(pNVar1,&local_1a8);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    glu::CallLogWrapper::glGetIntegerv(&_bufU->super_CallLogWrapper,0x90dd,(GLint *)&local_15c);
    glu::CallLogWrapper::glBindBufferRange
              (&_bufU->super_CallLogWrapper,0x90d2,local_15c,maxTFSize,0,4);
    NegativeTestContext::expectError(_bufU,0x501);
    NegativeTestContext::endSection(_bufU);
    pNVar1 = _bufU;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,
               "GL_INVALID_VALUE is generated if target is GL_ATOMIC_COUNTER_BUFFER and offset is not multiples of 4."
               ,&local_1d1);
    NegativeTestContext::beginSection(pNVar1,&local_1d0);
    std::__cxx11::string::~string((string *)&local_1d0);
    std::allocator<char>::~allocator(&local_1d1);
    glu::CallLogWrapper::glBindBufferRange(&_bufU->super_CallLogWrapper,0x92c0,0,maxUSize,5,4);
    NegativeTestContext::expectError(_bufU,0x501);
    NegativeTestContext::endSection(_bufU);
    glu::CallLogWrapper::glGetIntegerv(&_bufU->super_CallLogWrapper,0x90df,&local_160);
    pNVar1 = _bufU;
    if (local_160 != 1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,
                 "GL_INVALID_VALUE is generated if target is GL_SHADER_STORAGE_BUFFER and offset is not a multiple of the value of GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT."
                 ,&local_1f9);
      NegativeTestContext::beginSection(pNVar1,&local_1f8);
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      glu::CallLogWrapper::glBindBufferRange
                (&_bufU->super_CallLogWrapper,0x90d2,0,maxUSize,(long)(local_160 + 1),4);
      NegativeTestContext::expectError(_bufU,0x501);
      NegativeTestContext::endSection(_bufU);
    }
  }
  glu::CallLogWrapper::glDeleteBuffers(&_bufU->super_CallLogWrapper,1,(GLuint *)&maxTFSize);
  glu::CallLogWrapper::glDeleteBuffers(&_bufU->super_CallLogWrapper,1,(GLuint *)&maxUSize);
  glu::CallLogWrapper::glDeleteBuffers(&_bufU->super_CallLogWrapper,1,&bufTF);
  return;
}

Assistant:

void bind_buffer_range (NegativeTestContext& ctx)
{
	deUint32	bufAC		= 0x1234;
	deUint32	bufU		= 0x1234;
	deUint32	bufTF		= 0x1234;
	int			maxTFSize	= 0x1234;
	int			maxUSize	= 0x1234;
	int			uAlignment	= 0x1234;

	ctx.glGenBuffers(1, &bufU);
	ctx.glBindBuffer(GL_UNIFORM_BUFFER, bufU);
	ctx.glBufferData(GL_UNIFORM_BUFFER, 16, NULL, GL_STREAM_DRAW);

	ctx.glGenBuffers(1, &bufTF);
	ctx.glBindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, bufTF);
	ctx.glBufferData(GL_TRANSFORM_FEEDBACK_BUFFER, 16, NULL, GL_STREAM_DRAW);

	ctx.glGenBuffers(1, &bufAC);
	ctx.glBindBuffer(GL_ATOMIC_COUNTER_BUFFER, bufAC);
	ctx.glBufferData(GL_ATOMIC_COUNTER_BUFFER, 16, NULL, GL_STREAM_DRAW);

	ctx.beginSection("GL_INVALID_ENUM is generated if target is not GL_ATOMIC_COUNTER_BUFFER, GL_SHADER_STORAGE_BUFFER, GL_TRANSFORM_FEEDBACK_BUFFER or GL_UNIFORM_BUFFER.");
	ctx.glBindBufferRange(GL_ARRAY_BUFFER, 0, bufU, 0, 4);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER and index is greater than or equal to GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS.");
	ctx.glGetIntegerv(GL_MAX_TRANSFORM_FEEDBACK_SEPARATE_ATTRIBS, &maxTFSize);
	ctx.glBindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, maxTFSize, bufTF, 0, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and index is greater than or equal to GL_MAX_UNIFORM_BUFFER_BINDINGS.");
	ctx.glGetIntegerv(GL_MAX_UNIFORM_BUFFER_BINDINGS, &maxUSize);
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, maxUSize, bufU, 0, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if size is less than or equal to zero.");
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, 0, bufU, 0, -1);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, 0, bufU, 0, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if offset is less than zero.");
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, 0, bufU, -1, 0);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_TRANSFORM_FEEDBACK_BUFFER and size or offset are not multiples of 4.");
	ctx.glBindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bufTF, 4, 5);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glBindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bufTF, 5, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.glBindBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, bufTF, 5, 7);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_UNIFORM_BUFFER and offset is not a multiple of GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT.");
	ctx.glGetIntegerv(GL_UNIFORM_BUFFER_OFFSET_ALIGNMENT, &uAlignment);
	ctx.glBindBufferRange(GL_UNIFORM_BUFFER, 0, bufU, uAlignment+1, 4);
	ctx.expectError(GL_INVALID_VALUE);
	ctx.endSection();

	if (contextSupports(ctx.getRenderContext().getType(), glu::ApiType::es(3, 2)))
	{
		int maxACize	= 0x1234;
		int maxSSize	= 0x1234;
		int ssAlignment	= 0x1234;

		ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_ATOMIC_COUNTER_BUFFER and index is greater than or equal to GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS.");
		ctx.glGetIntegerv(GL_MAX_ATOMIC_COUNTER_BUFFER_BINDINGS, &maxACize);
		ctx.glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, maxACize, bufU, 0, 4);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_SHADER_STORAGE_BUFFER and index is greater than or equal to GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS.");
		ctx.glGetIntegerv(GL_MAX_SHADER_STORAGE_BUFFER_BINDINGS, &maxSSize);
		ctx.glBindBufferRange(GL_SHADER_STORAGE_BUFFER, maxSSize, bufU, 0, 4);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();

		ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_ATOMIC_COUNTER_BUFFER and offset is not multiples of 4.");
		ctx.glBindBufferRange(GL_ATOMIC_COUNTER_BUFFER, 0, bufTF, 5, 4);
		ctx.expectError(GL_INVALID_VALUE);
		ctx.endSection();

		ctx.glGetIntegerv(GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT, &ssAlignment);

		if (ssAlignment != 1)
		{
			ctx.beginSection("GL_INVALID_VALUE is generated if target is GL_SHADER_STORAGE_BUFFER and offset is not a multiple of the value of GL_SHADER_STORAGE_BUFFER_OFFSET_ALIGNMENT.");
			ctx.glBindBufferRange(GL_SHADER_STORAGE_BUFFER, 0, bufTF, ssAlignment+1, 4);
			ctx.expectError(GL_INVALID_VALUE);
			ctx.endSection();
		}
	}

	ctx.glDeleteBuffers(1, &bufU);
	ctx.glDeleteBuffers(1, &bufTF);
	ctx.glDeleteBuffers(1, &bufAC);
}